

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS
VerifyJsonParsesAsListOfStrings(_Bool IsJson5,char *Json,char **StringArray,size_t StringArrayCount)

{
  JlDataObject *pJVar1;
  size_t sVar2;
  JL_STATUS JVar3;
  JL_DATA_TYPE JVar4;
  uint32_t uVar5;
  JL_STATUS JVar6;
  int iVar7;
  size_t i;
  ulong uVar8;
  JlDataObject *object;
  JlDataObject *listObject;
  char *string;
  size_t errorAtPos;
  WJTL_STATUS local_6c;
  JlDataObject *local_68;
  JlDataObject *local_60;
  ulong local_58;
  char *local_50;
  JlListItem *local_48;
  char **local_40;
  size_t local_38;
  
  local_60 = (JlDataObject *)0x0;
  local_38 = 100;
  local_68 = (JlDataObject *)0x0;
  local_58 = StringArrayCount;
  local_40 = StringArray;
  JVar3 = JlParseJsonEx(Json,IsJson5,&local_60,&local_38);
  WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x23f);
  pJVar1 = local_60;
  WjTestLib_Assert(local_60 != (JlDataObject *)0x0,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x240);
  JVar4 = JlGetObjectType(local_60);
  WjTestLib_Assert(JVar4 == JL_DATA_TYPE_LIST,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x241);
  sVar2 = local_38;
  WjTestLib_Assert(local_38 == 0,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x242);
  uVar5 = JlGetListCount(local_60);
  local_6c = WJTL_STATUS_FAILED;
  if (uVar5 == local_58) {
    local_6c = WJTL_STATUS_SUCCESS;
  }
  if (sVar2 != 0) {
    local_6c = WJTL_STATUS_FAILED;
  }
  if (JVar4 != JL_DATA_TYPE_LIST) {
    local_6c = WJTL_STATUS_FAILED;
  }
  if (pJVar1 == (JlDataObject *)0x0) {
    local_6c = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_SUCCESS) {
    local_6c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(uVar5 == local_58,"JlGetListCount( listObject ) == StringArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x244);
  local_48 = (JlListItem *)0x0;
  for (uVar8 = 0; local_58 != uVar8; uVar8 = uVar8 + 1) {
    local_50 = (char *)0x0;
    local_68 = (JlDataObject *)0x0;
    JVar3 = JlGetObjectListNextItem(local_60,&local_68,&local_48);
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectListNextItem( listObject, &object, &enumerator ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24c);
    pJVar1 = local_68;
    WjTestLib_Assert(local_68 != (JlDataObject *)0x0,"(object) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24d);
    JVar6 = JlGetObjectString(local_68,&local_50);
    WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectString( object, &string ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24e);
    iVar7 = strcmp(local_50,local_40[uVar8]);
    if ((JVar6 != JL_STATUS_SUCCESS || JVar3 != JL_STATUS_SUCCESS) || iVar7 != 0) {
      local_6c = WJTL_STATUS_FAILED;
    }
    if (pJVar1 == (JlDataObject *)0x0) {
      local_6c = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(iVar7 == 0,"strcmp( string, StringArray[i] ) == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfStrings",0x24f);
  }
  JVar3 = JlGetObjectListNextItem(local_60,&local_68,&local_48);
  WjTestLib_Assert(JVar3 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &object, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x253);
  JVar6 = JlFreeObjectTree(&local_60);
  if (JVar6 != JL_STATUS_SUCCESS) {
    local_6c = WJTL_STATUS_FAILED;
  }
  if (JVar3 != JL_STATUS_END_OF_DATA) {
    local_6c = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfStrings",0x256);
  return local_6c;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfStrings
    (
        bool            IsJson5,
        char const*     Json,
        char const**    StringArray,
        size_t          StringArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   object = NULL;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == StringArrayCount );

    // Verify all elements in list match array
    enumerator = NULL;
    for( size_t i=0; i<StringArrayCount; i++ )
    {
        char const* string = NULL;
        object = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &object, &enumerator ) );
        JL_ASSERT_NOT_NULL( object );
        JL_ASSERT_SUCCESS( JlGetObjectString( object, &string ) );
        JL_ASSERT( strcmp( string, StringArray[i] ) == 0 );
    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &object, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}